

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::xtToName(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  int iVar1;
  uint uVar2;
  CAddr Value;
  Definition *pDVar3;
  Definition *pDVar4;
  uint uVar5;
  
  requireDStackDepth(this,1,"XT>NAME");
  requireDStackAvailable(this,1,"XT>NAME");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  pDVar3 = definitionsAt(this,uVar2);
  pDVar4 = definitionsAt(this,uVar2);
  iVar1 = this->vmSegmentParseBufferCounter;
  uVar2 = iVar1 + 1;
  uVar5 = iVar1 + 4;
  if (-1 < (int)uVar2) {
    uVar5 = uVar2;
  }
  this->vmSegmentParseBufferCounter = uVar2;
  Value = setVirtualMemory(this,&pDVar4->name,(iVar1 - (uVar5 & 0xfffffffc)) + 4);
  ForthStack<unsigned_int>::setTop(this_00,Value);
  ForthStack<unsigned_int>::push(this_00,(uint)(pDVar3->name)._M_string_length);
  return;
}

Assistant:

void xtToName() {
			REQUIRE_DSTACK_DEPTH(1, "XT>NAME");
			REQUIRE_DSTACK_AVAILABLE(1, "XT>NAME");
			auto xt = XT(dStack.getTop());
			auto& name = definitionsAt(xt).name;
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(definitionsAt(xt).name);
			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(name.length()));
		}